

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scope.cpp
# Opt level: O0

bool __thiscall slang::ast::Scope::handleDataDeclaration(Scope *this,DataDeclarationSyntax *syntax)

{
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  SourceRange sourceRange;
  bool bVar1;
  SyntaxNode *this_00;
  SourceLocation SVar2;
  DeclaratorSyntax *pDVar3;
  NetSymbol *__range;
  Symbol *pSVar4;
  NameSyntax *pNVar5;
  DefinitionSymbol *pDVar6;
  InstanceBodySymbol *this_01;
  SourceLocation in_RSI;
  DeferredMemberData *in_RDI;
  DeclaratorSyntax *decl_1;
  const_iterator __end2;
  const_iterator __begin2;
  SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *__range2;
  Symbol *def;
  Symbol *sym;
  Scope *currScope;
  Scope *in_stack_000000c8;
  NetSymbol *net;
  DeclaratorSyntax *decl;
  const_iterator __end3;
  const_iterator __begin3;
  SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *__range3;
  NetType *netType;
  Symbol *symbol;
  DeferredMemberIndex savedIndex;
  string_view name;
  NamedTypeSyntax *namedType;
  Scope *in_stack_00000198;
  bitmask<slang::ast::LookupFlags> in_stack_000001a4;
  undefined1 in_stack_000001a8 [16];
  DeclaratorSyntax *in_stack_fffffffffffffe98;
  Compilation *in_stack_fffffffffffffea0;
  SyntaxNode *in_stack_fffffffffffffea8;
  NetType *in_stack_fffffffffffffeb8;
  undefined1 in_stack_fffffffffffffec0 [16];
  Symbol *in_stack_fffffffffffffed0;
  pointer in_stack_fffffffffffffed8;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffffee0;
  SyntaxNode *in_stack_fffffffffffffef0;
  int *local_108;
  DeferredMemberData *local_c8;
  bitmask<slang::ast::LookupFlags> local_54;
  size_t local_50;
  char *local_48;
  Symbol *local_40;
  undefined4 local_38;
  DeferredMemberIndex local_34;
  size_t local_30;
  Scope *this_02;
  DeferredMemberData *pDVar7;
  DiagCode code;
  bool local_1;
  
  pDVar7 = in_RDI;
  this_00 = (SyntaxNode *)
            not_null<slang::syntax::DataTypeSyntax_*>::operator->
                      ((not_null<slang::syntax::DataTypeSyntax_*> *)0x9f0488);
  SVar2 = (SourceLocation)slang::syntax::SyntaxNode::as<slang::syntax::NamedTypeSyntax>(this_00);
  _local_30 = getIdentifierName((NamedTypeSyntax *)0x9f04a5);
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)&local_30);
  if (bVar1) {
    local_1 = false;
  }
  else {
    local_38 = 0;
    local_34 = std::
               exchange<slang::ast::Scope::DeferredMemberIndex,slang::ast::Scope::DeferredMemberIndex>
                         ((DeferredMemberIndex *)in_stack_fffffffffffffea0,
                          (DeferredMemberIndex *)in_stack_fffffffffffffe98);
    local_50 = local_30;
    local_48 = (char *)this_02;
    bitmask<slang::ast::LookupFlags>::bitmask(&local_54,None);
    local_40 = Lookup::unqualified(in_stack_00000198,(string_view)in_stack_000001a8,
                                   in_stack_000001a4);
    *(DeferredMemberIndex *)
     &(in_RDI->forwardingTypedefs).
      super__Vector_base<const_slang::ast::ForwardingTypedefSymbol_*,_std::allocator<const_slang::ast::ForwardingTypedefSymbol_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = local_34;
    if ((local_40 == (Symbol *)0x0) || (local_40->kind != NetType)) {
      if ((local_40 == (Symbol *)0x0) &&
         (pNVar5 = not_null<slang::syntax::NameSyntax_*>::operator->
                             ((not_null<slang::syntax::NameSyntax_*> *)0x9f07eb),
         (pNVar5->super_ExpressionSyntax).super_SyntaxNode.kind == IdentifierName)) {
        Compilation::tryGetDefinition((Compilation *)net,_decl,in_stack_000000c8);
        if ((local_108 == (int *)0x0) || (*local_108 != 2)) {
          local_1 = false;
        }
        else {
          pDVar6 = Symbol::as<slang::ast::DefinitionSymbol>((Symbol *)0x9f0869);
          if ((pDVar6->definitionKind == Interface) &&
             (pSVar4 = asSymbol((Scope *)in_RDI), pSVar4->kind == InstanceBody)) {
            asSymbol((Scope *)in_RDI);
            this_01 = Symbol::as<slang::ast::InstanceBodySymbol>((Symbol *)0x9f0890);
            pDVar6 = InstanceBodySymbol::getDefinition(this_01);
            if ((pDVar6->hasNonAnsiPorts & 1U) != 0) {
              addDeferredMembers((Scope *)in_RDI,in_stack_fffffffffffffea8);
              getOrAddDeferredData((Scope *)0x9f08bd);
              DeferredMemberData::addPortDeclaration
                        (in_RDI,in_stack_fffffffffffffea8,(Symbol *)in_stack_fffffffffffffea0);
              return true;
            }
          }
          slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::begin
                    ((SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *)0x9f0900);
          slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::end
                    ((SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *)0x9f0914);
          while (bVar1 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::iterator_base<const_slang::syntax::DeclaratorSyntax_*>_>
                                   ((self_type *)in_stack_fffffffffffffea0,
                                    (iterator_base<const_slang::syntax::DeclaratorSyntax_*> *)
                                    in_stack_fffffffffffffe98), ((bVar1 ^ 0xffU) & 1) != 0) {
            pDVar3 = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::iterator_base<const_slang::syntax::DeclaratorSyntax_*>,_false>
                     ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::iterator_base<const_slang::syntax::DeclaratorSyntax_*>,_false>
                                  *)0x9f093f);
            if (pDVar3->initializer != (EqualsValueClauseSyntax *)0x0) {
              return false;
            }
            iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::iterator_base<const_slang::syntax::DeclaratorSyntax_*>,_false>
            ::
            operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::iterator_base<const_slang::syntax::DeclaratorSyntax_*>_>
                      ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::iterator_base<const_slang::syntax::DeclaratorSyntax_*>,_false>
                        *)in_stack_fffffffffffffea0);
          }
          addDeferredMembers((Scope *)in_RDI,in_stack_fffffffffffffea8);
          local_1 = true;
        }
      }
      else {
        local_1 = false;
      }
    }
    else {
      Symbol::as<slang::ast::NetType>((Symbol *)0x9f0594);
      slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::begin
                ((SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *)0x9f05bf);
      slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::end
                ((SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *)0x9f05dc);
      while (bVar1 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::iterator_base<const_slang::syntax::DeclaratorSyntax_*>_>
                               ((self_type *)in_stack_fffffffffffffea0,
                                (iterator_base<const_slang::syntax::DeclaratorSyntax_*> *)
                                in_stack_fffffffffffffe98), local_c8 = in_RDI,
            ((bVar1 ^ 0xffU) & 1) != 0) {
        pDVar3 = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::iterator_base<const_slang::syntax::DeclaratorSyntax_*>,_false>
                 ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::iterator_base<const_slang::syntax::DeclaratorSyntax_*>,_false>
                              *)0x9f0619);
        in_stack_fffffffffffffea0 =
             (Compilation *)
             (in_RDI->members).
             super__Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>._M_impl
             .super__Vector_impl_data._M_start;
        parsing::Token::valueText((Token *)in_RDI);
        parsing::Token::location(&pDVar3->name);
        __range = BumpAllocator::
                  emplace<slang::ast::NetSymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,slang::ast::NetType_const&>
                            ((BumpAllocator *)in_stack_fffffffffffffed0,
                             in_stack_fffffffffffffec0._8_8_,in_stack_fffffffffffffec0._0_8_,
                             in_stack_fffffffffffffeb8);
        ValueSymbol::setFromDeclarator
                  ((ValueSymbol *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
        std::span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>::
        span<const_slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>_&>
                  ((span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>
                    *)in_RDI,(SyntaxList<slang::syntax::AttributeInstanceSyntax> *)__range);
        syntax_00._M_extent._M_extent_value = in_stack_fffffffffffffee0._M_extent_value;
        syntax_00._M_ptr = in_stack_fffffffffffffed8;
        Symbol::setAttributes(in_stack_fffffffffffffed0,in_stack_fffffffffffffec0._8_8_,syntax_00);
        addMember((Scope *)in_stack_fffffffffffffea0,(Symbol *)in_stack_fffffffffffffe98);
        iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::iterator_base<const_slang::syntax::DeclaratorSyntax_*>,_false>
        ::
        operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::iterator_base<const_slang::syntax::DeclaratorSyntax_*>_>
                  ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::iterator_base<const_slang::syntax::DeclaratorSyntax_*>,_false>
                    *)in_stack_fffffffffffffea0);
      }
      do {
        pSVar4 = asSymbol((Scope *)local_c8);
        code = SUB84((ulong)pDVar7 >> 0x20,0);
        if (pSVar4->kind == InstanceBody) break;
        if (pSVar4->kind == CheckerInstanceBody) {
          slang::syntax::SyntaxNode::sourceRange(in_stack_fffffffffffffef0);
          sourceRange.endLoc = in_RSI;
          sourceRange.startLoc = SVar2;
          addDiag(this_02,code,sourceRange);
          break;
        }
        local_c8 = (DeferredMemberData *)Symbol::getParentScope(pSVar4);
      } while (local_c8 != (DeferredMemberData *)0x0);
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

bool Scope::handleDataDeclaration(const DataDeclarationSyntax& syntax) {
    auto& namedType = syntax.type->as<NamedTypeSyntax>();
    std::string_view name = getIdentifierName(namedType);
    if (name.empty())
        return false;

    // We aren't elaborated yet so can't do a normal lookup in this scope.
    // Temporarily swap out the deferred member index so that the lookup
    // doesn't trigger elaboration.
    auto savedIndex = std::exchange(deferredMemberIndex, DeferredMemberIndex::Invalid);
    auto symbol = Lookup::unqualified(*this, name);
    deferredMemberIndex = savedIndex;

    // If we found a net type, this is actually one or more net symbols.
    if (symbol && symbol->kind == SymbolKind::NetType) {
        auto& netType = symbol->as<NetType>();
        for (auto decl : syntax.declarators) {
            auto net = compilation.emplace<NetSymbol>(decl->name.valueText(), decl->name.location(),
                                                      netType);
            net->setFromDeclarator(*decl);
            net->setAttributes(*this, syntax.attributes);
            addMember(*net);
        }

        // Make sure we're not declared within a checker.
        const Scope* currScope = this;
        do {
            auto& sym = currScope->asSymbol();
            if (sym.kind == SymbolKind::InstanceBody)
                break;

            if (sym.kind == SymbolKind::CheckerInstanceBody) {
                addDiag(diag::NotAllowedInChecker, syntax.sourceRange());
                break;
            }

            currScope = sym.getParentScope();
        } while (currScope);

        return true;
    }

    // No user-defined net type found. If this is a simple name and no symbol at all
    // was found we should continue on to see if this is a non-ansi interface port.
    if (symbol || namedType.name->kind != SyntaxKind::IdentifierName)
        return false;

    auto def = compilation.tryGetDefinition(name, *this).definition;
    if (!def || def->kind != SymbolKind::Definition)
        return false;

    // If we're in an instance and have non-ansi ports then assume that this is
    // a non-ansi interface port definition.
    if (def->as<DefinitionSymbol>().definitionKind == DefinitionKind::Interface &&
        asSymbol().kind == SymbolKind::InstanceBody &&
        asSymbol().as<InstanceBodySymbol>().getDefinition().hasNonAnsiPorts) {

        // Save for later when we process the ports.
        addDeferredMembers(syntax);
        getOrAddDeferredData().addPortDeclaration(syntax, lastMember);
        return true;
    }

    // If we made it this far it's probably a malformed instantiation -- the user forgot
    // to include the parentheses. Let's just treat it like an instantiation instead, as
    // long as there are no decl initializers (which would never look like an instantiation).
    for (auto decl : syntax.declarators) {
        if (decl->initializer)
            return false;
    }

    addDeferredMembers(syntax);
    return true;
}